

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-helpers.h
# Opt level: O2

target_ulong do_check_ieee_exceptions(CPUSPARCState_conflict1 *env,uintptr_t ra)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  bVar1 = (env->fp_status).float_exception_flags;
  uVar2 = env->fsr;
  if (bVar1 == 0) {
    return uVar2;
  }
  (env->fp_status).float_exception_flags = '\0';
  uVar3 = bVar1 >> 5 & 1 | bVar1 >> 1 & 2 | bVar1 >> 2 & 4 | bVar1 & 8 | (bVar1 & 1) << 4;
  uVar4 = uVar3 | uVar2;
  if (((uint)((uVar2 & 0xffffffff) >> 0x17) & (uint)uVar4 & 0x1f) == 0) {
    return (uVar3 | (uint)uVar2 & 0x1f) << 5 | uVar4;
  }
  env->fsr = uVar4 | 0x4000;
  *(undefined4 *)(env[-1].regbase + 0x1c5) = 0x21;
  cpu_loop_exit_restore_sparc64((CPUState *)(env[-5].regbase + 0x201),ra);
}

Assistant:

static inline int get_float_exception_flags(float_status *status)
{
    return status->float_exception_flags;
}